

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O3

If_Man_t * Abc_NtkToIf(Abc_Ntk_t *pNtk,If_Par_t *pPars)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  void *pvVar2;
  long *plVar3;
  If_Obj_t *pIVar4;
  If_Man_t *p;
  size_t sVar5;
  char *__dest;
  Abc_Obj_t *pAVar6;
  If_Obj_t *pIVar7;
  ProgressBar *p_00;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                  ,0xd9,"If_Man_t *Abc_NtkToIf(Abc_Ntk_t *, If_Par_t *)");
  }
  p = If_ManStart(pPars);
  pcVar10 = pNtk->pName;
  if (pcVar10 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar10);
    __dest = (char *)malloc(sVar5 + 1);
    strcpy(__dest,pcVar10);
  }
  p->pName = __dest;
  if (1.0 < (double)p->nObjBytes * (double)pNtk->nObjs * 9.313225746154785e-10) {
    printf(
          "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n"
          );
  }
  Abc_NtkCleanCopy(pNtk);
  aVar1 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
  pAVar6 = Abc_AigConst1(pNtk);
  pAVar6->field_6 = aVar1;
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar11];
      pIVar7 = If_ManCreateCi(p);
      *(If_Obj_t **)((long)pvVar2 + 0x40) = pIVar7;
      *(uint *)pIVar7 =
           (*(uint *)pIVar7 & 0x1fff) + (*(uint *)((long)pvVar2 + 0x14) & 0xfffff000) * 2;
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk->vCis;
    } while (lVar11 < pVVar8->nSize);
  }
  p_00 = Extra_ProgressBarStart(_stdout,pNtk->vObjs->nSize);
  pVVar8 = Abc_AigDfs(pNtk,0,0);
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar11];
      if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar11)) {
        Extra_ProgressBarUpdate_int(p_00,(int)lVar11,"Initial");
      }
      lVar9 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
      pIVar7 = If_ManCreateAnd(p,(If_Obj_t *)
                                 ((ulong)(*(uint *)((long)plVar3 + 0x14) >> 10 & 1) ^
                                 *(ulong *)(*(long *)(lVar9 + (long)*(int *)plVar3[4] * 8) + 0x40)),
                               (If_Obj_t *)
                               ((ulong)(*(uint *)((long)plVar3 + 0x14) >> 0xb & 1) ^
                               *(ulong *)(*(long *)(lVar9 + (long)((int *)plVar3[4])[1] * 8) + 0x40)
                               ));
      plVar3[8] = (long)pIVar7;
      if (((ulong)plVar3 & 1) != 0) {
        pcVar10 = "!Abc_ObjIsComplement(pNode)";
LAB_002c9af6:
        __assert_fail(pcVar10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                      ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
      }
      if (*(int *)*plVar3 != 3) {
        pcVar10 = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_002c9af6;
      }
      lVar9 = plVar3[7];
      if ((lVar9 != 0) && (0 < *(int *)((long)plVar3 + 0x2c))) {
        if (pIVar7->Id <= *(int *)(*(long *)(lVar9 + 0x40) + 4)) {
          __assert_fail("If_ObjId(Abc_ObjIfCopy(pNode)) > If_ObjId(Abc_ObjIfCopy(Abc_ObjEquiv(pNode)))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                        ,0xfd,"If_Man_t *Abc_NtkToIf(Abc_Ntk_t *, If_Par_t *)");
        }
        do {
          pIVar4 = *(If_Obj_t **)(lVar9 + 0x40);
          pIVar7->pEquiv = pIVar4;
          lVar9 = *(long *)(lVar9 + 0x38);
          pIVar7 = pIVar4;
        } while (lVar9 != 0);
        If_ManCreateChoice(p,(If_Obj_t *)plVar3[8]);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar8->nSize);
  }
  Extra_ProgressBarStop(p_00);
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar11];
      pIVar7 = If_ManCreateCo(p,(If_Obj_t *)
                                ((ulong)(*(uint *)((long)plVar3 + 0x14) >> 10 & 1) ^
                                *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                    (long)*(int *)plVar3[4] * 8) + 0x40)));
      plVar3[8] = (long)pIVar7;
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar11 < pVVar8->nSize);
  }
  return p;
}

Assistant:

If_Man_t * Abc_NtkToIf( Abc_Ntk_t * pNtk, If_Par_t * pPars )
{
    ProgressBar * pProgress;
    If_Man_t * pIfMan;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pIfMan = If_ManStart( pPars );
    pIfMan->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );

    // print warning about excessive memory usage
    if ( 1.0 * Abc_NtkObjNum(pNtk) * pIfMan->nObjBytes / (1<<30) > 1.0 )
        printf( "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n", 
            1.0 * Abc_NtkObjNum(pNtk) * pIfMan->nObjBytes / (1<<30), Abc_NtkObjNum(pNtk) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)If_ManConst1( pIfMan );
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateCi( pIfMan );
        // transfer logic level information
        Abc_ObjIfCopy(pNode)->Level = pNode->Level;
    }

    // load the AIG into the mapper
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    vNodes = Abc_AigDfs( pNtk, 0, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, "Initial" );
        // add the node to the mapper
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateAnd( pIfMan, 
            If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin0(pNode)), Abc_ObjFaninC0(pNode) ), 
            If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin1(pNode)), Abc_ObjFaninC1(pNode) ) );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
        {
            Abc_Obj_t * pEquiv;
//            int Counter = 0;
            assert( If_ObjId(Abc_ObjIfCopy(pNode)) > If_ObjId(Abc_ObjIfCopy(Abc_ObjEquiv(pNode))) );
            for ( pPrev = pNode, pEquiv = Abc_ObjEquiv(pPrev); pEquiv; pPrev = pEquiv, pEquiv = Abc_ObjEquiv(pPrev) )
                If_ObjSetChoice( Abc_ObjIfCopy(pPrev), Abc_ObjIfCopy(pEquiv) );//, Counter++;
//            printf( "%d ", Counter );
            If_ManCreateChoice( pIfMan, Abc_ObjIfCopy(pNode) );
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_PtrFree( vNodes );

    // set the primary outputs without copying the phase
    Abc_NtkForEachCo( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateCo( pIfMan, If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin0(pNode)), Abc_ObjFaninC0(pNode) ) );
    return pIfMan;
}